

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O1

void Sto_ManDumpClauses(Sto_Man_t *p,char *pFileName)

{
  uint uVar1;
  Sto_Cls_t *pSVar2;
  uint uVar3;
  FILE *__stream;
  uint uVar4;
  ulong uVar5;
  
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"p %d %d %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses,
            (ulong)(uint)p->nRoots,(ulong)(uint)p->nClausesA);
    for (pSVar2 = p->pHead; pSVar2 != (Sto_Cls_t *)0x0; pSVar2 = pSVar2->pNext) {
      if ((*(uint *)&pSVar2->field_0x1c & 0x7fffff8) != 0) {
        uVar5 = 0;
        do {
          uVar1 = *(uint *)((long)&pSVar2[1].pNext + uVar5 * 4);
          uVar4 = (int)uVar1 >> 1;
          uVar3 = ~uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4 + 1;
          }
          fprintf(__stream," %d",(ulong)uVar3);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (*(uint *)&pSVar2->field_0x1c >> 3 & 0xffffff));
      }
      fwrite(" 0\n",3,1,__stream);
    }
    fclose(__stream);
    return;
  }
  printf("Error: Cannot open output file (%s).\n",pFileName);
  return;
}

Assistant:

void Sto_ManDumpClauses( Sto_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Sto_Cls_t * pClause;
    int i;
    // start the file
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Error: Cannot open output file (%s).\n", pFileName );
        return;
    }
    // write the data
    fprintf( pFile, "p %d %d %d %d\n", p->nVars, p->nClauses, p->nRoots, p->nClausesA );
    Sto_ManForEachClause( p, pClause )
    {
        for ( i = 0; i < (int)pClause->nLits; i++ )
            fprintf( pFile, " %d", lit_print(pClause->pLits[i]) );
        fprintf( pFile, " 0\n" );
    }
//    fprintf( pFile, " 0\n" );
    fclose( pFile );
}